

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * coda_strxstr(char *s,char *n,size_t len)

{
  char cVar1;
  __int32_t *p_Var2;
  size_t sVar3;
  __int32_t **pp_Var4;
  size_t sVar5;
  char *pcVar6;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    if (n == (char *)0x0) {
      return s;
    }
    cVar1 = *n;
    if ((long)cVar1 == 0) {
      return s;
    }
    sVar3 = strlen(n);
    if (sVar3 <= len) {
      pcVar6 = s + len;
      for (; s < pcVar6; s = s + 1) {
        pp_Var4 = __ctype_tolower_loc();
        p_Var2 = *pp_Var4;
        if (p_Var2[*s] == p_Var2[cVar1]) {
          sVar5 = 0;
          while (((s + sVar5 < pcVar6 && (n + sVar5 < n + sVar3)) &&
                 (p_Var2[s[sVar5]] == p_Var2[n[sVar5]]))) {
            sVar5 = sVar5 + 1;
          }
          if (sVar3 == sVar5) {
            return s;
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *coda_strxstr(const char *s, const char *n, size_t len)
{
	const char *w;
	const char *x;
	const char *es;
	const char *en;
	size_t nsz;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;
	if (len < (nsz = strlen(n))) return NULL;

	es = s + len;
	en = n + nsz;

	for (; s < es; ++s)
	{
		if (tolower(*s) == tolower(*n))
		{
			for (w = s, x = n; w < es && x < en; ++w, ++x)
			{
				if (tolower(*w) != tolower(*x)) break;
			}

			if (x == en) return (char *) s;
		}
	}

	return NULL;
}